

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O3

void vkt::geometry::checkGeometryShaderSupport
               (InstanceInterface *vki,VkPhysicalDevice physDevice,int numGeometryShaderInvocations)

{
  NotSupportedError *pNVar1;
  VkPhysicalDeviceFeatures features;
  int local_464;
  string local_460;
  char *local_440 [59];
  uint local_264;
  VkPhysicalDeviceFeatures local_104;
  
  local_464 = numGeometryShaderInvocations;
  ::vk::getPhysicalDeviceFeatures(&local_104,vki,physDevice);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_440,vki,physDevice);
  if (local_104.geometryShader == 0) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,"Missing feature: geometryShader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryTestsUtil.cpp"
               ,0x2d7);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((numGeometryShaderInvocations != 0) && (local_264 < (uint)numGeometryShaderInvocations)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_460,&local_464);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                   "Unsupported limit: maxGeometryShaderInvocations < ",&local_460);
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,local_440[0],(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryTestsUtil.cpp"
               ,0x2da);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void checkGeometryShaderSupport (const InstanceInterface& vki, const VkPhysicalDevice physDevice, const int numGeometryShaderInvocations)
{
	const VkPhysicalDeviceFeatures	features	= getPhysicalDeviceFeatures  (vki, physDevice);
	const VkPhysicalDeviceLimits	limits		= getPhysicalDeviceProperties(vki, physDevice).limits;

	if (!features.geometryShader)
		TCU_THROW(NotSupportedError, "Missing feature: geometryShader");

	if (numGeometryShaderInvocations != 0 && limits.maxGeometryShaderInvocations < static_cast<deUint32>(numGeometryShaderInvocations))
		TCU_THROW(NotSupportedError, ("Unsupported limit: maxGeometryShaderInvocations < " + de::toString(numGeometryShaderInvocations)).c_str());
}